

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::prepareWorkload
          (OperatorPerformanceCase *this,int progNdx,int workload)

{
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
            (this,(ulong)(((this->m_programs).
                           super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[progNdx].m_ptr)->m_program).
                         m_program);
  render(this,(this->m_calibrator).m_measureState.numDrawCalls);
  return;
}

Assistant:

void OperatorPerformanceCase::prepareWorkload (int progNdx, int workload)
{
	setWorkloadSizeUniform(m_programs[progNdx]->getProgram(), workload);
	render(m_calibrator.getCallCount());
}